

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmscreen.cpp
# Opt level: O1

void __thiscall QEglFSKmsGbmScreen::updateFlipStatus(QEglFSKmsGbmScreen *this)

{
  bool *pbVar1;
  long lVar2;
  CloneDestination *pCVar3;
  long lVar4;
  bool bVar5;
  
  if (this->m_cloneSource != (QEglFSKmsGbmScreen *)0x0) {
    return;
  }
  if (this->m_flipPending == false) {
    lVar2 = (this->m_cloneDests).d.size;
    bVar5 = lVar2 == 0;
    if (!bVar5) {
      pCVar3 = (this->m_cloneDests).d.ptr;
      if (pCVar3->cloneFlipPending == false) {
        lVar4 = 0;
        do {
          bVar5 = lVar2 * 0x10 + -0x10 == lVar4;
          if (bVar5) goto LAB_00113f37;
          pbVar1 = &pCVar3[1].cloneFlipPending + lVar4;
          lVar4 = lVar4 + 0x10;
        } while (*pbVar1 != true);
      }
      if (!bVar5) {
        return;
      }
    }
LAB_00113f37:
    if (this->m_gbm_bo_current != (gbm_bo *)0x0) {
      gbm_surface_release_buffer(this->m_gbm_surface);
    }
    this->m_gbm_bo_current = this->m_gbm_bo_next;
    this->m_gbm_bo_next = (gbm_bo *)0x0;
  }
  return;
}

Assistant:

void QEglFSKmsGbmScreen::updateFlipStatus()
{
    // only for 'real' outputs that own the color buffer, i.e. that are not cloning another one
    if (m_cloneSource)
        return;

    // proceed only if flips for both this and all others that clone this have finished
    if (m_flipPending)
        return;

    for (const CloneDestination &d : std::as_const(m_cloneDests)) {
        if (d.cloneFlipPending)
            return;
    }

    if (m_gbm_bo_current) {
        gbm_surface_release_buffer(m_gbm_surface,
                                   m_gbm_bo_current);
    }

    m_gbm_bo_current = m_gbm_bo_next;
    m_gbm_bo_next = nullptr;
}